

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::QueryInterface
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,INTERFACE_ID *IID,
          IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface == (IObject **)0x0) {
    return;
  }
  bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_PipelineResourceSignature);
  if (bVar1) {
    *ppInterface = (IObject *)this;
    (*(this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).super_ObjectBase<Diligent::IPipelineResourceSignature>.
      super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
      super_IDeviceObject.super_IObject._vptr_IObject[1])(this);
    return;
  }
  DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ::QueryInterface(&this->
                    super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                   ,IID,ppInterface);
  return;
}

Assistant:

GetStaticVariableCount(SHADER_TYPE ShaderType) const override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get the number of static variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return 0;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return 0;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariableCount();
    }